

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqfuncstate.cpp
# Opt level: O0

void Dump(OutputStream *stream,SQFuncState *fState)

{
  SQInt32 i_count;
  char *stream_00;
  SQInstruction *ii;
  SQObjectPtr *_literals;
  long in_RSI;
  OutputStream *in_RDI;
  SQInteger idx;
  SQObjectPtr val;
  SQObjectPtr key;
  SQObjectPtr refidx;
  SQObjectPtrVec literals;
  SQObjectPtr *in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffee0;
  SQInt32 in_stack_fffffffffffffee4;
  SQObjectPtr *in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef4;
  SQObjectPtr *in_stack_fffffffffffffef8;
  SQObjectPtr *in_stack_ffffffffffffff00;
  SQInt32 _nlocalvarinfos;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  OutputStream *in_stack_ffffffffffffff10;
  SQTable *in_stack_ffffffffffffff18;
  SQObjectPtr *in_stack_ffffffffffffff50;
  SQInt32 _nliterals;
  size_type local_70;
  sqvector<SQObjectPtr,_unsigned_int> local_28;
  long local_10;
  OutputStream *local_8;
  
  if (*(int *)(in_RSI + 0x118) == 0x8000010) {
    stream_00 = (char *)(*(long *)(in_RSI + 0x120) + 0x38);
  }
  else {
    stream_00 = "unknown";
  }
  local_10 = in_RSI;
  local_8 = in_RDI;
  streamprintf(in_RDI,"*****FUNCTION [%s]\n",stream_00);
  sqvector<SQObjectPtr,_unsigned_int>::sqvector
            (&local_28,(SQAllocContext)**(undefined8 **)(local_10 + 0x1e8));
  ii = (SQInstruction *)SQTable::CountUsed(*(SQTable **)(local_10 + 0x100));
  i_count = (SQInt32)ii;
  SQObjectPtr::SQObjectPtr
            ((SQObjectPtr *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
  sqvector<SQObjectPtr,_unsigned_int>::resize
            ((sqvector<SQObjectPtr,_unsigned_int> *)
             CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
             (size_type)((ulong)in_stack_fffffffffffffee8 >> 0x20),
             (SQObjectPtr *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
  SQObjectPtr::~SQObjectPtr
            ((SQObjectPtr *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
  SQObjectPtr::SQObjectPtr
            ((SQObjectPtr *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
  SQObjectPtr::SQObjectPtr
            ((SQObjectPtr *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
  SQObjectPtr::SQObjectPtr
            ((SQObjectPtr *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
  while( true ) {
    _nliterals = (SQInt32)((ulong)in_stack_ffffffffffffff50 >> 0x20);
    _literals = (SQObjectPtr *)
                SQTable::Next(in_stack_ffffffffffffff18,
                              SUB81((ulong)in_stack_ffffffffffffff10 >> 0x38,0),
                              (SQObjectPtr *)
                              CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                              in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    if (_literals == (SQObjectPtr *)0xffffffffffffffff) break;
    in_stack_ffffffffffffff50 = sqvector<SQObjectPtr,_unsigned_int>::operator[](&local_28,local_70);
    SQObjectPtr::operator=
              ((SQObjectPtr *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
               in_stack_fffffffffffffee8);
    SQObjectPtr::operator=
              ((SQObjectPtr *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
               (SQInteger)in_stack_fffffffffffffed8);
  }
  SQObjectPtr::~SQObjectPtr
            ((SQObjectPtr *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
  _nlocalvarinfos = (SQInt32)((ulong)in_stack_ffffffffffffff00 >> 0x20);
  SQObjectPtr::~SQObjectPtr
            ((SQObjectPtr *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
  SQObjectPtr::~SQObjectPtr
            ((SQObjectPtr *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
  sqvector<SQObjectPtr,_unsigned_int>::begin(&local_28);
  sqvector<SQObjectPtr,_unsigned_int>::size(&local_28);
  DumpLiterals((OutputStream *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
               in_stack_fffffffffffffed8,0);
  sqvector<SQLocalVarInfo,_unsigned_int>::begin
            ((sqvector<SQLocalVarInfo,_unsigned_int> *)(local_10 + 0xe0));
  sqvector<SQLocalVarInfo,_unsigned_int>::size
            ((sqvector<SQLocalVarInfo,_unsigned_int> *)(local_10 + 0xe0));
  DumpLocals(in_stack_ffffffffffffff10,
             (SQLocalVarInfo *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
             _nlocalvarinfos);
  sqvector<SQLineInfo,_unsigned_int>::begin
            ((sqvector<SQLineInfo,_unsigned_int> *)(local_10 + 0x140));
  sqvector<SQLineInfo,_unsigned_int>::size((sqvector<SQLineInfo,_unsigned_int> *)(local_10 + 0x140))
  ;
  DumpLineInfo((OutputStream *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
               (SQLineInfo *)in_stack_fffffffffffffee8,in_stack_fffffffffffffee4);
  streamprintf(local_8,"-----dump\n");
  sqvector<SQInstruction,_unsigned_int>::begin
            ((sqvector<SQInstruction,_unsigned_int> *)(local_10 + 200));
  sqvector<SQInstruction,_unsigned_int>::size
            ((sqvector<SQInstruction,_unsigned_int> *)(local_10 + 200));
  sqvector<SQObjectPtr,_unsigned_int>::begin(&local_28);
  sqvector<SQObjectPtr,_unsigned_int>::size(&local_28);
  DumpInstructions((OutputStream *)stream_00,ii,i_count,_literals,_nliterals);
  sqvector<SQObjectPtr,_unsigned_int>::~sqvector((sqvector<SQObjectPtr,_unsigned_int> *)0x150eab);
  return;
}

Assistant:

void Dump(OutputStream *stream, const SQFuncState *fState)
{
    streamprintf(stream, _SC("*****FUNCTION [%s]\n"), sq_type(fState->_name) == OT_STRING ? _stringval(fState->_name) : _SC("unknown"));
    SQObjectPtrVec literals(fState->_sharedstate->_alloc_ctx);
    literals.resize(_table(fState->_literals)->CountUsed());
    {
        SQObjectPtr refidx,key,val;
        SQInteger idx;
        while((idx=_table(fState->_literals)->Next(false,refidx,key,val))!=-1) {
            literals[_integer(val)]=key;
            refidx=idx;
        }
    }
    DumpLiterals(stream, literals.begin(), literals.size());
    DumpLocals(stream, fState->_localvarinfos.begin(), fState->_localvarinfos.size());
    DumpLineInfo(stream, fState->_lineinfos.begin(), fState->_lineinfos.size());
    streamprintf(stream, _SC("-----dump\n"));
    DumpInstructions(stream, fState->_instructions.begin(), fState->_instructions.size(), literals.begin(), literals.size());
}